

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftRigidDynamicsWorld::btSoftRigidDynamicsWorld
          (btSoftRigidDynamicsWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btConstraintSolver *constraintSolver,btCollisionConfiguration *collisionConfiguration,
          btSoftBodySolver *softBodySolver)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btSoftBodyWorldInfo *in_RDI;
  undefined8 in_R9;
  btCollisionConfiguration *unaff_retaddr;
  btConstraintSolver *in_stack_00000008;
  btBroadphaseInterface *in_stack_00000010;
  btDispatcher *in_stack_00000018;
  btDiscreteDynamicsWorld *in_stack_00000020;
  void *ptr;
  undefined8 in_stack_ffffffffffffff68;
  int alignment;
  btAlignedObjectArray<btSoftBody_*> *in_stack_ffffffffffffff70;
  btVector3 *pbVar2;
  btScalar in_stack_ffffffffffffff90;
  btScalar in_stack_ffffffffffffff94;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btBroadphaseInterface *local_58;
  btDispatcher *pbStack_50;
  void *local_48;
  undefined8 local_30;
  undefined8 local_18;
  undefined8 local_10;
  
  alignment = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_30 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *(undefined ***)in_RDI = &PTR__btSoftRigidDynamicsWorld_002e8a60;
  btAlignedObjectArray<btSoftBody_*>::btAlignedObjectArray(in_stack_ffffffffffffff70);
  pbVar2 = &in_RDI[4].water_normal;
  btSoftBodyWorldInfo::btSoftBodyWorldInfo(in_RDI);
  *(undefined8 *)in_RDI[5].water_normal.m_floats = local_30;
  *(undefined1 *)(in_RDI[5].water_normal.m_floats + 2) = 0;
  if (*(long *)in_RDI[5].water_normal.m_floats == 0) {
    pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff70,alignment);
    local_48 = pvVar1;
    btDefaultSoftBodySolver::btDefaultSoftBodySolver((btDefaultSoftBodySolver *)in_RDI);
    *(void **)in_RDI[5].water_normal.m_floats = pvVar1;
    *(undefined1 *)(in_RDI[5].water_normal.m_floats + 2) = 1;
  }
  in_RDI[4].water_offset = 6.02839e-42;
  *(undefined1 *)&in_RDI[4].m_maxDisplacement = 1;
  *(undefined1 *)((long)&in_RDI[4].m_maxDisplacement + 1) = 0;
  *(undefined1 *)((long)&in_RDI[4].m_maxDisplacement + 2) = 0;
  *(undefined8 *)in_RDI[4].m_gravity.m_floats = local_18;
  *(undefined8 *)(in_RDI[4].m_gravity.m_floats + 2) = local_10;
  btSparseSdf<3>::Initialize((btSparseSdf<3> *)in_RDI,(int)((ulong)pbVar2 >> 0x20),(int)pbVar2);
  btSparseSdf<3>::Reset
            ((btSparseSdf<3> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  in_RDI[4].water_normal.m_floats[0] = 1.2;
  in_RDI[4].water_normal.m_floats[1] = 0.0;
  in_RDI[4].water_normal.m_floats[2] = 0.0;
  local_5c = 0.0;
  local_60 = 0.0;
  local_64 = 0.0;
  btVector3::btVector3((btVector3 *)&local_58,&local_5c,&local_60,&local_64);
  in_RDI[4].m_broadphase = local_58;
  in_RDI[4].m_dispatcher = pbStack_50;
  local_68 = 0.0;
  btVector3::setValue((btVector3 *)&in_RDI[4].m_sparsesdf,&local_68,
                      (btScalar *)&stack0xffffffffffffff94,(btScalar *)&stack0xffffffffffffff90);
  btSparseSdf<3>::Initialize((btSparseSdf<3> *)in_RDI,(int)((ulong)pbVar2 >> 0x20),(int)pbVar2);
  return;
}

Assistant:

btSoftRigidDynamicsWorld::btSoftRigidDynamicsWorld(
	btDispatcher* dispatcher,
	btBroadphaseInterface* pairCache,
	btConstraintSolver* constraintSolver,
	btCollisionConfiguration* collisionConfiguration,
	btSoftBodySolver *softBodySolver ) : 
		btDiscreteDynamicsWorld(dispatcher,pairCache,constraintSolver,collisionConfiguration),
		m_softBodySolver( softBodySolver ),
		m_ownsSolver(false)
{
	if( !m_softBodySolver )
	{
		void* ptr = btAlignedAlloc(sizeof(btDefaultSoftBodySolver),16);
		m_softBodySolver = new(ptr) btDefaultSoftBodySolver();
		m_ownsSolver = true;
	}

	m_drawFlags			=	fDrawFlags::Std;
	m_drawNodeTree		=	true;
	m_drawFaceTree		=	false;
	m_drawClusterTree	=	false;
	m_sbi.m_broadphase = pairCache;
	m_sbi.m_dispatcher = dispatcher;
	m_sbi.m_sparsesdf.Initialize();
	m_sbi.m_sparsesdf.Reset();

	m_sbi.air_density		=	(btScalar)1.2;
	m_sbi.water_density	=	0;
	m_sbi.water_offset		=	0;
	m_sbi.water_normal		=	btVector3(0,0,0);
	m_sbi.m_gravity.setValue(0,-10,0);

	m_sbi.m_sparsesdf.Initialize();


}